

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::SubGridMBIntersector1Pluecker<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar12;
  Geometry *pGVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  AABBNodeMB4D *node1;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  bool bVar52;
  float fVar53;
  float fVar85;
  float fVar86;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined4 uVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  float fVar117;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_15d9;
  RTCRayQueryContext *local_15d8;
  Geometry *local_15d0;
  RTCIntersectArguments *local_15c8;
  Ray *local_15c0;
  ulong local_15b8;
  ulong local_15b0;
  uint local_15a4;
  uint local_15a0;
  int local_159c;
  Scene *local_1598;
  ulong local_1590;
  RayQueryContext *local_1588;
  undefined1 local_1580 [16];
  long local_1568;
  long local_1560;
  ulong local_1558;
  long local_1550;
  long local_1548;
  long local_1540;
  ulong *local_1538;
  ulong local_1530;
  long local_1528;
  long local_1520;
  long local_1518;
  long local_1510;
  long local_1508;
  float local_1500;
  float local_14fc;
  float local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  undefined4 local_14e8;
  uint local_14e4;
  uint local_14e0;
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 *local_12e0;
  byte local_12d8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  uint uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  uint uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1588 = context;
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
    auVar59 = vucomiss_avx512f(ZEXT416((uint)ray->tfar));
    auVar124 = ZEXT1664(auVar59);
    if (local_1200 < 9) {
      local_1538 = local_11f8;
      aVar1 = (ray->dir).field_0;
      auVar54 = vmaxss_avx512f(auVar59,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar55._8_4_ = 0x7fffffff;
      auVar55._0_8_ = 0x7fffffff7fffffff;
      auVar55._12_4_ = 0x7fffffff;
      auVar55 = vandps_avx512vl((undefined1  [16])aVar1,auVar55);
      auVar56._8_4_ = 0x219392ef;
      auVar56._0_8_ = 0x219392ef219392ef;
      auVar56._12_4_ = 0x219392ef;
      uVar46 = vcmpps_avx512vl(auVar55,auVar56,1);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = 0x3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar55 = vdivps_avx(auVar100,(undefined1  [16])aVar1);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar52 = (bool)((byte)uVar46 & 1);
      auVar58._0_4_ = (uint)bVar52 * auVar56._0_4_ | (uint)!bVar52 * auVar55._0_4_;
      bVar52 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar52 * auVar56._4_4_ | (uint)!bVar52 * auVar55._4_4_;
      bVar52 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar52 * auVar56._8_4_ | (uint)!bVar52 * auVar55._8_4_;
      bVar52 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar52 * auVar56._12_4_ | (uint)!bVar52 * auVar55._12_4_;
      auVar57._8_4_ = 0x3f7ffffa;
      auVar57._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar57._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar58,auVar57);
      auVar24._8_4_ = 0x3f800003;
      auVar24._0_8_ = 0x3f8000033f800003;
      auVar24._12_4_ = 0x3f800003;
      auVar57 = vmulps_avx512vl(auVar58,auVar24);
      auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar125 = ZEXT3264(auVar60);
      auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar126 = ZEXT3264(auVar60);
      auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar127 = ZEXT3264(auVar60);
      auVar56 = vucomiss_avx512f(auVar59);
      auVar60 = vbroadcastss_avx512vl(auVar56);
      auVar128 = ZEXT3264(auVar60);
      auVar55 = vmovshdup_avx(auVar56);
      auVar60 = vbroadcastsd_avx512vl(auVar55);
      auVar129 = ZEXT3264(auVar60);
      vshufpd_avx(auVar56,auVar56,1);
      auVar61._8_4_ = 2;
      auVar61._0_8_ = 0x200000002;
      auVar61._12_4_ = 2;
      auVar61._16_4_ = 2;
      auVar61._20_4_ = 2;
      auVar61._24_4_ = 2;
      auVar61._28_4_ = 2;
      local_1360 = vpermps_avx2(auVar61,ZEXT1632(auVar56));
      auVar114 = ZEXT3264(local_1360);
      fVar89 = auVar57._0_4_;
      auVar60._8_4_ = 1;
      auVar60._0_8_ = 0x100000001;
      auVar60._12_4_ = 1;
      auVar60._16_4_ = 1;
      auVar60._20_4_ = 1;
      auVar60._24_4_ = 1;
      auVar60._28_4_ = 1;
      local_13a0 = vpermps_avx2(auVar60,ZEXT1632(auVar57));
      auVar118 = ZEXT3264(local_13a0);
      local_13c0 = vpermps_avx2(auVar61,ZEXT1632(auVar57));
      auVar120 = ZEXT3264(local_13c0);
      lVar50 = 0;
      vucomiss_avx512f(auVar59);
      lVar51 = 0x40;
      vucomiss_avx512f(auVar59);
      uVar96 = auVar54._0_4_;
      local_13e0._4_4_ = uVar96;
      local_13e0._0_4_ = uVar96;
      local_13e0._8_4_ = uVar96;
      local_13e0._12_4_ = uVar96;
      local_13e0._16_4_ = uVar96;
      local_13e0._20_4_ = uVar96;
      local_13e0._24_4_ = uVar96;
      local_13e0._28_4_ = uVar96;
      auVar122 = ZEXT3264(local_13e0);
      local_1400 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar123 = ZEXT3264(local_1400);
      local_1560 = 0;
      local_1380 = fVar89;
      fStack_137c = fVar89;
      fStack_1378 = fVar89;
      fStack_1374 = fVar89;
      fStack_1370 = fVar89;
      fStack_136c = fVar89;
      fStack_1368 = fVar89;
      fStack_1364 = fVar89;
      local_1568 = 0x40;
      fVar117 = fVar89;
      fVar53 = fVar89;
      fVar85 = fVar89;
      fVar86 = fVar89;
      fVar87 = fVar89;
      fVar88 = fVar89;
      local_15c0 = ray;
      do {
        uVar46 = local_1538[-1];
        local_1538 = local_1538 + -1;
        while ((uVar46 & 8) == 0) {
          uVar39 = uVar46 & 0xfffffffffffffff0;
          uVar96 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar66._4_4_ = uVar96;
          auVar66._0_4_ = uVar96;
          auVar66._8_4_ = uVar96;
          auVar66._12_4_ = uVar96;
          auVar66._16_4_ = uVar96;
          auVar66._20_4_ = uVar96;
          auVar66._24_4_ = uVar96;
          auVar66._28_4_ = uVar96;
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + lVar50),auVar66,
                                    *(undefined1 (*) [32])(uVar39 + 0x40 + lVar50));
          auVar60 = vsubps_avx512vl(ZEXT1632(auVar59),auVar125._0_32_);
          auVar61 = vmulps_avx512vl(auVar128._0_32_,auVar60);
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + lVar51),auVar66,
                                    *(undefined1 (*) [32])(uVar39 + 0x40 + lVar51));
          auVar60 = vsubps_avx512vl(ZEXT1632(auVar59),auVar126._0_32_);
          auVar60 = vmulps_avx512vl(auVar129._0_32_,auVar60);
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x180),auVar66,
                                    *(undefined1 (*) [32])(uVar39 + 0xc0));
          auVar62 = vsubps_avx512vl(ZEXT1632(auVar59),auVar127._0_32_);
          auVar63._4_4_ = auVar114._4_4_ * auVar62._4_4_;
          auVar63._0_4_ = auVar114._0_4_ * auVar62._0_4_;
          auVar63._8_4_ = auVar114._8_4_ * auVar62._8_4_;
          auVar63._12_4_ = auVar114._12_4_ * auVar62._12_4_;
          auVar63._16_4_ = auVar114._16_4_ * auVar62._16_4_;
          auVar63._20_4_ = auVar114._20_4_ * auVar62._20_4_;
          auVar63._24_4_ = auVar114._24_4_ * auVar62._24_4_;
          auVar63._28_4_ = auVar62._28_4_;
          auVar60 = vmaxps_avx(auVar60,auVar63);
          auVar61 = vmaxps_avx(auVar122._0_32_,auVar61);
          auVar60 = vmaxps_avx(auVar61,auVar60);
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x120),auVar66,
                                    *(undefined1 (*) [32])(uVar39 + 0x60));
          auVar61 = vsubps_avx512vl(ZEXT1632(auVar59),auVar125._0_32_);
          auVar62._4_4_ = fVar117 * auVar61._4_4_;
          auVar62._0_4_ = fVar89 * auVar61._0_4_;
          auVar62._8_4_ = fVar53 * auVar61._8_4_;
          auVar62._12_4_ = fVar85 * auVar61._12_4_;
          auVar62._16_4_ = fVar86 * auVar61._16_4_;
          auVar62._20_4_ = fVar87 * auVar61._20_4_;
          auVar62._24_4_ = fVar88 * auVar61._24_4_;
          auVar62._28_4_ = auVar61._28_4_;
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x160),auVar66,
                                    *(undefined1 (*) [32])(uVar39 + 0xa0));
          auVar61 = vsubps_avx512vl(ZEXT1632(auVar59),auVar126._0_32_);
          auVar64._4_4_ = auVar118._4_4_ * auVar61._4_4_;
          auVar64._0_4_ = auVar118._0_4_ * auVar61._0_4_;
          auVar64._8_4_ = auVar118._8_4_ * auVar61._8_4_;
          auVar64._12_4_ = auVar118._12_4_ * auVar61._12_4_;
          auVar64._16_4_ = auVar118._16_4_ * auVar61._16_4_;
          auVar64._20_4_ = auVar118._20_4_ * auVar61._20_4_;
          auVar64._24_4_ = auVar118._24_4_ * auVar61._24_4_;
          auVar64._28_4_ = auVar61._28_4_;
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x1a0),auVar66,
                                    *(undefined1 (*) [32])(uVar39 + 0xe0));
          auVar61 = vsubps_avx512vl(ZEXT1632(auVar59),auVar127._0_32_);
          auVar65._4_4_ = auVar120._4_4_ * auVar61._4_4_;
          auVar65._0_4_ = auVar120._0_4_ * auVar61._0_4_;
          auVar65._8_4_ = auVar120._8_4_ * auVar61._8_4_;
          auVar65._12_4_ = auVar120._12_4_ * auVar61._12_4_;
          auVar65._16_4_ = auVar120._16_4_ * auVar61._16_4_;
          auVar65._20_4_ = auVar120._20_4_ * auVar61._20_4_;
          auVar65._24_4_ = auVar120._24_4_ * auVar61._24_4_;
          auVar65._28_4_ = auVar61._28_4_;
          auVar61 = vminps_avx(auVar64,auVar65);
          auVar63 = vminps_avx512vl(auVar123._0_32_,auVar62);
          auVar61 = vminps_avx(auVar63,auVar61);
          if (((uint)uVar46 & 7) == 6) {
            uVar21 = vcmpps_avx512vl(auVar60,auVar61,2);
            uVar22 = vcmpps_avx512vl(auVar66,*(undefined1 (*) [32])(uVar39 + 0x1c0),0xd);
            uVar23 = vcmpps_avx512vl(auVar66,*(undefined1 (*) [32])(uVar39 + 0x1e0),1);
            uVar41 = (uint)uVar21 & (uint)uVar22 & (uint)uVar23;
          }
          else {
            uVar21 = vcmpps_avx512vl(auVar60,auVar61,2);
            uVar41 = (uint)uVar21;
          }
          if ((byte)uVar41 == 0) goto LAB_0069e558;
          lVar49 = 0;
          for (uVar46 = (ulong)(byte)uVar41; (uVar46 & 1) == 0;
              uVar46 = uVar46 >> 1 | 0x8000000000000000) {
            lVar49 = lVar49 + 1;
          }
          uVar46 = *(ulong *)(uVar39 + lVar49 * 8);
          uVar41 = (uVar41 & 0xff) - 1 & uVar41 & 0xff;
          uVar42 = (ulong)uVar41;
          if (uVar41 != 0) {
            *local_1538 = uVar46;
            lVar49 = 0;
            for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar49 = lVar49 + 1;
            }
            uVar41 = uVar41 - 1 & uVar41;
            uVar42 = (ulong)uVar41;
            bVar52 = uVar41 == 0;
            while( true ) {
              local_1538 = local_1538 + 1;
              uVar46 = *(ulong *)(uVar39 + lVar49 * 8);
              if (bVar52) break;
              *local_1538 = uVar46;
              lVar49 = 0;
              for (uVar46 = uVar42; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                lVar49 = lVar49 + 1;
              }
              uVar42 = uVar42 - 1 & uVar42;
              bVar52 = uVar42 == 0;
            }
          }
        }
        local_1540 = (ulong)((uint)uVar46 & 0xf) - 8;
        if (local_1540 != 0) {
          uVar46 = uVar46 & 0xfffffffffffffff0;
          local_1548 = 0;
          do {
            lVar49 = local_1548 * 0xe0;
            fVar90 = ((ray->dir).field_0.m128[3] - *(float *)(uVar46 + 0xd0 + lVar49)) *
                     *(float *)(uVar46 + 0xd4 + lVar49);
            auVar94._8_8_ = 0;
            auVar94._0_8_ = *(ulong *)(uVar46 + 0x40 + lVar49);
            auVar97._8_8_ = 0;
            auVar97._0_8_ = *(ulong *)(uVar46 + 0x48 + lVar49);
            uVar21 = vpcmpub_avx512vl(auVar94,auVar97,2);
            auVar60 = vpmovzxbd_avx2(auVar94);
            auVar60 = vcvtdq2ps_avx(auVar60);
            uVar96 = *(undefined4 *)(uVar46 + 0x7c + lVar49);
            auVar72._4_4_ = uVar96;
            auVar72._0_4_ = uVar96;
            auVar72._8_4_ = uVar96;
            auVar72._12_4_ = uVar96;
            auVar72._16_4_ = uVar96;
            auVar72._20_4_ = uVar96;
            auVar72._24_4_ = uVar96;
            auVar72._28_4_ = uVar96;
            uVar96 = *(undefined4 *)(uVar46 + 0x70 + lVar49);
            auVar74._4_4_ = uVar96;
            auVar74._0_4_ = uVar96;
            auVar74._8_4_ = uVar96;
            auVar74._12_4_ = uVar96;
            auVar74._16_4_ = uVar96;
            auVar74._20_4_ = uVar96;
            auVar74._24_4_ = uVar96;
            auVar74._28_4_ = uVar96;
            auVar55 = vfmadd213ps_fma(auVar60,auVar72,auVar74);
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)(uVar46 + 0x88 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar59);
            uVar96 = *(undefined4 *)(uVar46 + 0xc4 + lVar49);
            auVar77._4_4_ = uVar96;
            auVar77._0_4_ = uVar96;
            auVar77._8_4_ = uVar96;
            auVar77._12_4_ = uVar96;
            auVar77._16_4_ = uVar96;
            auVar77._20_4_ = uVar96;
            auVar77._24_4_ = uVar96;
            auVar77._28_4_ = uVar96;
            uVar96 = *(undefined4 *)(uVar46 + 0xb8 + lVar49);
            auVar78._4_4_ = uVar96;
            auVar78._0_4_ = uVar96;
            auVar78._8_4_ = uVar96;
            auVar78._12_4_ = uVar96;
            auVar78._16_4_ = uVar96;
            auVar78._20_4_ = uVar96;
            auVar78._24_4_ = uVar96;
            auVar78._28_4_ = uVar96;
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar59 = vfmadd213ps_fma(auVar60,auVar77,auVar78);
            auVar71._4_4_ = fVar90;
            auVar71._0_4_ = fVar90;
            auVar71._8_4_ = fVar90;
            auVar71._12_4_ = fVar90;
            auVar71._16_4_ = fVar90;
            auVar71._20_4_ = fVar90;
            auVar71._24_4_ = fVar90;
            auVar71._28_4_ = fVar90;
            auVar60 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar55));
            auVar59 = vfmadd213ps_fma(auVar60,auVar71,ZEXT1632(auVar55));
            auVar60 = vpmovzxbd_avx2(auVar97);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar55 = vfmadd213ps_fma(auVar60,auVar72,auVar74);
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)(uVar46 + 0x90 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar54);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar56 = vfmadd213ps_fma(auVar60,auVar77,auVar78);
            auVar60 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar55));
            auVar55 = vfmadd213ps_fma(auVar60,auVar71,ZEXT1632(auVar55));
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(uVar46 + 0x50 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar3);
            uVar96 = *(undefined4 *)(uVar46 + 0x80 + lVar49);
            auVar73._4_4_ = uVar96;
            auVar73._0_4_ = uVar96;
            auVar73._8_4_ = uVar96;
            auVar73._12_4_ = uVar96;
            auVar73._16_4_ = uVar96;
            auVar73._20_4_ = uVar96;
            auVar73._24_4_ = uVar96;
            auVar73._28_4_ = uVar96;
            auVar60 = vcvtdq2ps_avx(auVar60);
            uVar96 = *(undefined4 *)(uVar46 + 0x74 + lVar49);
            auVar75._4_4_ = uVar96;
            auVar75._0_4_ = uVar96;
            auVar75._8_4_ = uVar96;
            auVar75._12_4_ = uVar96;
            auVar75._16_4_ = uVar96;
            auVar75._20_4_ = uVar96;
            auVar75._24_4_ = uVar96;
            auVar75._28_4_ = uVar96;
            auVar56 = vfmadd213ps_fma(auVar60,auVar73,auVar75);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(uVar46 + 0x98 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar4);
            auVar60 = vcvtdq2ps_avx(auVar60);
            uVar96 = *(undefined4 *)(uVar46 + 200 + lVar49);
            auVar79._4_4_ = uVar96;
            auVar79._0_4_ = uVar96;
            auVar79._8_4_ = uVar96;
            auVar79._12_4_ = uVar96;
            auVar79._16_4_ = uVar96;
            auVar79._20_4_ = uVar96;
            auVar79._24_4_ = uVar96;
            auVar79._28_4_ = uVar96;
            uVar96 = *(undefined4 *)(uVar46 + 0xbc + lVar49);
            auVar81._4_4_ = uVar96;
            auVar81._0_4_ = uVar96;
            auVar81._8_4_ = uVar96;
            auVar81._12_4_ = uVar96;
            auVar81._16_4_ = uVar96;
            auVar81._20_4_ = uVar96;
            auVar81._24_4_ = uVar96;
            auVar81._28_4_ = uVar96;
            auVar57 = vfmadd213ps_fma(auVar60,auVar79,auVar81);
            auVar60 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar56));
            auVar56 = vfmadd213ps_fma(auVar60,auVar71,ZEXT1632(auVar56));
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(uVar46 + 0x58 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar5);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar57 = vfmadd213ps_fma(auVar60,auVar73,auVar75);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(uVar46 + 0xa0 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar6);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar24 = vfmadd213ps_fma(auVar60,auVar79,auVar81);
            auVar60 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar57));
            auVar57 = vfmadd213ps_fma(auVar60,auVar71,ZEXT1632(auVar57));
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)(uVar46 + 0x60 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar7);
            uVar96 = *(undefined4 *)(uVar46 + 0x84 + lVar49);
            auVar76._4_4_ = uVar96;
            auVar76._0_4_ = uVar96;
            auVar76._8_4_ = uVar96;
            auVar76._12_4_ = uVar96;
            auVar76._16_4_ = uVar96;
            auVar76._20_4_ = uVar96;
            auVar76._24_4_ = uVar96;
            auVar76._28_4_ = uVar96;
            uVar96 = *(undefined4 *)(uVar46 + 0x78 + lVar49);
            auVar80._4_4_ = uVar96;
            auVar80._0_4_ = uVar96;
            auVar80._8_4_ = uVar96;
            auVar80._12_4_ = uVar96;
            auVar80._16_4_ = uVar96;
            auVar80._20_4_ = uVar96;
            auVar80._24_4_ = uVar96;
            auVar80._28_4_ = uVar96;
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar24 = vfmadd213ps_fma(auVar60,auVar76,auVar80);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(uVar46 + 0xa8 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar8);
            uVar96 = *(undefined4 *)(uVar46 + 0xcc + lVar49);
            auVar82._4_4_ = uVar96;
            auVar82._0_4_ = uVar96;
            auVar82._8_4_ = uVar96;
            auVar82._12_4_ = uVar96;
            auVar82._16_4_ = uVar96;
            auVar82._20_4_ = uVar96;
            auVar82._24_4_ = uVar96;
            auVar82._28_4_ = uVar96;
            auVar60 = vcvtdq2ps_avx(auVar60);
            uVar96 = *(undefined4 *)(uVar46 + 0xc0 + lVar49);
            auVar112._4_4_ = uVar96;
            auVar112._0_4_ = uVar96;
            auVar112._8_4_ = uVar96;
            auVar112._12_4_ = uVar96;
            auVar112._16_4_ = uVar96;
            auVar112._20_4_ = uVar96;
            auVar112._24_4_ = uVar96;
            auVar112._28_4_ = uVar96;
            auVar54 = vfmadd213ps_fma(auVar60,auVar82,auVar112);
            auVar60 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar24));
            auVar24 = vfmadd213ps_fma(auVar60,auVar71,ZEXT1632(auVar24));
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)(uVar46 + 0x68 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar9);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar54 = vfmadd213ps_fma(auVar60,auVar76,auVar80);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)(uVar46 + 0xb0 + lVar49);
            auVar60 = vpmovzxbd_avx2(auVar10);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar58 = vfmadd213ps_fma(auVar60,auVar82,auVar112);
            auVar60 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar54));
            auVar54 = vfmadd213ps_fma(auVar60,auVar71,ZEXT1632(auVar54));
            auVar60 = vsubps_avx512vl(ZEXT1632(auVar59),auVar125._0_32_);
            auVar60 = vmulps_avx512vl(auVar128._0_32_,auVar60);
            auVar61 = vsubps_avx512vl(ZEXT1632(auVar56),auVar126._0_32_);
            auVar62 = vmulps_avx512vl(auVar129._0_32_,auVar61);
            auVar61 = vsubps_avx512vl(ZEXT1632(auVar24),auVar127._0_32_);
            auVar67._4_4_ = auVar114._4_4_ * auVar61._4_4_;
            auVar67._0_4_ = auVar114._0_4_ * auVar61._0_4_;
            auVar67._8_4_ = auVar114._8_4_ * auVar61._8_4_;
            auVar67._12_4_ = auVar114._12_4_ * auVar61._12_4_;
            auVar67._16_4_ = auVar114._16_4_ * auVar61._16_4_;
            auVar67._20_4_ = auVar114._20_4_ * auVar61._20_4_;
            auVar67._24_4_ = auVar114._24_4_ * auVar61._24_4_;
            auVar67._28_4_ = auVar61._28_4_;
            auVar61 = vsubps_avx512vl(ZEXT1632(auVar55),auVar125._0_32_);
            auVar68._4_4_ = fVar117 * auVar61._4_4_;
            auVar68._0_4_ = fVar89 * auVar61._0_4_;
            auVar68._8_4_ = fVar53 * auVar61._8_4_;
            auVar68._12_4_ = fVar85 * auVar61._12_4_;
            auVar68._16_4_ = fVar86 * auVar61._16_4_;
            auVar68._20_4_ = fVar87 * auVar61._20_4_;
            auVar68._24_4_ = fVar88 * auVar61._24_4_;
            auVar68._28_4_ = auVar61._28_4_;
            auVar61 = vsubps_avx512vl(ZEXT1632(auVar57),auVar126._0_32_);
            auVar69._4_4_ = auVar118._4_4_ * auVar61._4_4_;
            auVar69._0_4_ = auVar118._0_4_ * auVar61._0_4_;
            auVar69._8_4_ = auVar118._8_4_ * auVar61._8_4_;
            auVar69._12_4_ = auVar118._12_4_ * auVar61._12_4_;
            auVar69._16_4_ = auVar118._16_4_ * auVar61._16_4_;
            auVar69._20_4_ = auVar118._20_4_ * auVar61._20_4_;
            auVar69._24_4_ = auVar118._24_4_ * auVar61._24_4_;
            auVar69._28_4_ = auVar61._28_4_;
            auVar61 = vsubps_avx512vl(ZEXT1632(auVar54),auVar127._0_32_);
            auVar70._4_4_ = auVar120._4_4_ * auVar61._4_4_;
            auVar70._0_4_ = auVar120._0_4_ * auVar61._0_4_;
            auVar70._8_4_ = auVar120._8_4_ * auVar61._8_4_;
            auVar70._12_4_ = auVar120._12_4_ * auVar61._12_4_;
            auVar70._16_4_ = auVar120._16_4_ * auVar61._16_4_;
            auVar70._20_4_ = auVar120._20_4_ * auVar61._20_4_;
            auVar70._24_4_ = auVar120._24_4_ * auVar61._24_4_;
            auVar70._28_4_ = auVar61._28_4_;
            auVar61 = vpminsd_avx2(auVar60,auVar68);
            auVar60 = vpmaxsd_avx2(auVar60,auVar68);
            auVar63 = vpminsd_avx2(auVar62,auVar69);
            auVar61 = vpmaxsd_avx2(auVar61,auVar63);
            auVar63 = vpmaxsd_avx2(auVar62,auVar69);
            auVar62 = vpminsd_avx2(auVar60,auVar63);
            auVar63 = vpminsd_avx2(auVar67,auVar70);
            auVar60 = vpmaxsd_avx2(auVar67,auVar70);
            auVar63 = vpmaxsd_avx2(auVar63,auVar122._0_32_);
            auVar61 = vpmaxsd_avx2(auVar61,auVar63);
            auVar60 = vpminsd_avx512vl(auVar60,auVar123._0_32_);
            auVar60 = vpminsd_avx2(auVar62,auVar60);
            uVar22 = vpcmpd_avx512vl(auVar61,auVar60,2);
            if ((byte)((byte)uVar22 & (byte)uVar21) != 0) {
              uVar39 = (ulong)(byte)((byte)uVar22 & (byte)uVar21);
              local_1550 = lVar49 + uVar46;
              local_1598 = local_1588->scene;
              do {
                local_1530 = uVar39;
                lVar50 = 0;
                for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                  lVar50 = lVar50 + 1;
                }
                uVar11 = *(ushort *)(local_1550 + lVar50 * 8);
                uVar12 = *(ushort *)(local_1550 + 2 + lVar50 * 8);
                local_1590 = (ulong)*(uint *)(local_1550 + 0xd8);
                local_1558 = (ulong)*(uint *)(local_1550 + 4 + lVar50 * 8);
                pGVar13 = (local_1598->geometries).items[local_1590].ptr;
                local_1520 = *(long *)&pGVar13->field_0x58;
                fVar117 = (pGVar13->time_range).lower;
                fVar117 = pGVar13->fnumTimeSegments *
                          (((ray->dir).field_0.m128[3] - fVar117) /
                          ((pGVar13->time_range).upper - fVar117));
                auVar59 = vroundss_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),9);
                auVar55 = vaddss_avx512f(ZEXT416((uint)pGVar13->fnumTimeSegments),
                                         SUB6416(ZEXT464(0xbf800000),0));
                auVar59 = vminss_avx(auVar59,auVar55);
                auVar58 = vmaxss_avx512f(auVar124._0_16_,auVar59);
                local_1528 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * local_1558;
                local_15a0 = uVar11 & 0x7fff;
                local_15a4 = uVar12 & 0x7fff;
                uVar41 = *(uint *)(local_1520 + 4 + local_1528);
                uVar47 = (ulong)uVar41;
                uVar42 = (ulong)(uVar41 * local_15a4 +
                                *(int *)(local_1520 + local_1528) + local_15a0);
                lVar50 = *(long *)&pGVar13[2].numPrimitives;
                lVar43 = (long)(int)auVar58._0_4_ * 0x38;
                lVar51 = *(long *)(lVar50 + 0x10 + lVar43);
                lVar49 = *(long *)(lVar50 + lVar43);
                auVar59 = *(undefined1 (*) [16])(lVar49 + lVar51 * uVar42);
                lVar14 = *(long *)(lVar50 + 0x48 + lVar43);
                auVar55 = *(undefined1 (*) [16])(lVar49 + (uVar42 + 1) * lVar51);
                lVar48 = uVar47 + uVar42;
                auVar56 = *(undefined1 (*) [16])(lVar49 + lVar48 * lVar51);
                lVar45 = uVar42 + uVar47 + 1;
                auVar57 = *(undefined1 (*) [16])(lVar49 + lVar45 * lVar51);
                local_1580._0_8_ = lVar14 * uVar42;
                local_1508 = lVar14 * lVar48;
                local_1510 = lVar14 * lVar45;
                uVar39 = (ulong)(-1 < (short)uVar11);
                lVar40 = uVar42 + uVar39 + 1;
                auVar24 = *(undefined1 (*) [16])(lVar49 + lVar40 * lVar51);
                lVar44 = uVar39 + lVar45;
                auVar54 = *(undefined1 (*) [16])(lVar49 + lVar44 * lVar51);
                local_1518 = lVar14 * lVar44;
                uVar39 = 0;
                if (-1 < (short)uVar12) {
                  uVar39 = uVar47;
                }
                auVar100 = *(undefined1 (*) [16])(lVar49 + (lVar48 + uVar39) * lVar51);
                auVar3 = *(undefined1 (*) [16])(lVar49 + (lVar45 + uVar39) * lVar51);
                auVar4 = *(undefined1 (*) [16])(lVar49 + lVar51 * (uVar39 + lVar44));
                lVar50 = *(long *)(lVar50 + 0x38 + lVar43);
                fVar117 = fVar117 - auVar58._0_4_;
                auVar91._4_4_ = fVar117;
                auVar91._0_4_ = fVar117;
                auVar91._8_4_ = fVar117;
                auVar91._12_4_ = fVar117;
                auVar58 = vsubps_avx(*(undefined1 (*) [16])(lVar50 + lVar14 * uVar42),auVar59);
                auVar5 = vfmadd213ps_fma(auVar58,auVar91,auVar59);
                auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar50 + lVar14 * (uVar42 + 1)),auVar55)
                ;
                auVar6 = vfmadd213ps_fma(auVar59,auVar91,auVar55);
                auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar50 + lVar14 * lVar48),auVar56);
                auVar7 = vfmadd213ps_fma(auVar59,auVar91,auVar56);
                auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar50 + lVar14 * lVar45),auVar57);
                auVar8 = vfmadd213ps_fma(auVar59,auVar91,auVar57);
                auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar50 + lVar14 * lVar40),auVar24);
                auVar55 = vfmadd213ps_fma(auVar59,auVar91,auVar24);
                auVar59 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar50 + lVar14 * lVar44),auVar54);
                auVar9 = vfmadd213ps_fma(auVar59,auVar91,auVar54);
                auVar59 = vsubps_avx512vl(*(undefined1 (*) [16])
                                           (lVar50 + lVar14 * (lVar48 + uVar39)),auVar100);
                auVar100 = vfmadd213ps_fma(auVar59,auVar91,auVar100);
                auVar59 = vsubps_avx512vl(*(undefined1 (*) [16])
                                           (lVar50 + lVar14 * (lVar45 + uVar39)),auVar3);
                auVar3 = vfmadd213ps_fma(auVar59,auVar91,auVar3);
                auVar59 = vsubps_avx512vl(*(undefined1 (*) [16])
                                           (lVar50 + (uVar39 + lVar44) * lVar14),auVar4);
                auVar4 = vfmadd213ps_fma(auVar59,auVar91,auVar4);
                auVar56 = vunpcklps_avx(auVar6,auVar9);
                auVar59 = vunpckhps_avx(auVar6,auVar9);
                auVar57 = vunpcklps_avx(auVar55,auVar8);
                auVar55 = vunpckhps_avx(auVar55,auVar8);
                auVar24 = vunpcklps_avx(auVar59,auVar55);
                auVar54 = vunpcklps_avx(auVar56,auVar57);
                auVar59 = vunpckhps_avx(auVar56,auVar57);
                auVar57 = vunpcklps_avx(auVar7,auVar3);
                auVar55 = vunpckhps_avx(auVar7,auVar3);
                auVar58 = vunpcklps_avx(auVar8,auVar100);
                auVar56 = vunpckhps_avx(auVar8,auVar100);
                auVar56 = vunpcklps_avx(auVar55,auVar56);
                auVar100 = vunpcklps_avx(auVar57,auVar58);
                auVar55 = vunpckhps_avx(auVar57,auVar58);
                auVar101._16_16_ = auVar3;
                auVar101._0_16_ = auVar7;
                auVar98._16_16_ = auVar9;
                auVar98._0_16_ = auVar6;
                auVar60 = vunpcklps_avx(auVar98,auVar101);
                auVar107._16_16_ = auVar4;
                auVar107._0_16_ = auVar8;
                auVar95._16_16_ = auVar8;
                auVar95._0_16_ = auVar5;
                auVar61 = vunpcklps_avx(auVar95,auVar107);
                auVar62 = vunpcklps_avx(auVar61,auVar60);
                auVar61 = vunpckhps_avx(auVar61,auVar60);
                auVar60 = vunpckhps_avx(auVar98,auVar101);
                auVar63 = vunpckhps_avx(auVar95,auVar107);
                auVar63 = vunpcklps_avx(auVar63,auVar60);
                auVar99._16_16_ = auVar54;
                auVar99._0_16_ = auVar54;
                auVar92._16_16_ = auVar59;
                auVar92._0_16_ = auVar59;
                auVar102._16_16_ = auVar24;
                auVar102._0_16_ = auVar24;
                auVar108._16_16_ = auVar100;
                auVar108._0_16_ = auVar100;
                auVar115._16_16_ = auVar55;
                auVar115._0_16_ = auVar55;
                uVar96 = *(undefined4 *)&(local_15c0->org).field_0;
                auVar119._4_4_ = uVar96;
                auVar119._0_4_ = uVar96;
                auVar119._8_4_ = uVar96;
                auVar119._12_4_ = uVar96;
                auVar119._16_4_ = uVar96;
                auVar119._20_4_ = uVar96;
                auVar119._24_4_ = uVar96;
                auVar119._28_4_ = uVar96;
                uVar96 = *(undefined4 *)((long)&(local_15c0->org).field_0 + 4);
                auVar121._4_4_ = uVar96;
                auVar121._0_4_ = uVar96;
                auVar121._8_4_ = uVar96;
                auVar121._12_4_ = uVar96;
                auVar121._16_4_ = uVar96;
                auVar121._20_4_ = uVar96;
                auVar121._24_4_ = uVar96;
                auVar121._28_4_ = uVar96;
                auVar64 = vbroadcastss_avx512vl(ZEXT416((uint)(local_15c0->org).field_0.m128[2]));
                uVar96 = *(undefined4 *)&(local_15c0->dir).field_0;
                auVar105._4_4_ = uVar96;
                auVar105._0_4_ = uVar96;
                auVar105._8_4_ = uVar96;
                auVar105._12_4_ = uVar96;
                auVar105._16_4_ = uVar96;
                auVar105._20_4_ = uVar96;
                auVar105._24_4_ = uVar96;
                auVar105._28_4_ = uVar96;
                auVar65 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
                uVar96 = *(undefined4 *)((long)&(local_15c0->dir).field_0 + 4);
                auVar110._4_4_ = uVar96;
                auVar110._0_4_ = uVar96;
                auVar110._8_4_ = uVar96;
                auVar110._12_4_ = uVar96;
                auVar110._16_4_ = uVar96;
                auVar110._20_4_ = uVar96;
                auVar110._24_4_ = uVar96;
                auVar110._28_4_ = uVar96;
                fVar117 = (local_15c0->dir).field_0.m128[2];
                auVar113._4_4_ = fVar117;
                auVar113._0_4_ = fVar117;
                auVar113._8_4_ = fVar117;
                auVar113._12_4_ = fVar117;
                auVar113._16_4_ = fVar117;
                auVar113._20_4_ = fVar117;
                auVar113._24_4_ = fVar117;
                auVar113._28_4_ = fVar117;
                auVar60 = vsubps_avx(auVar62,auVar119);
                auVar61 = vsubps_avx(auVar61,auVar121);
                auVar66 = vsubps_avx512vl(auVar63,auVar64);
                auVar63 = vsubps_avx(auVar99,auVar119);
                auVar62 = vsubps_avx(auVar92,auVar121);
                auVar67 = vsubps_avx512vl(auVar102,auVar64);
                auVar68 = vsubps_avx512vl(auVar108,auVar119);
                auVar69 = vsubps_avx512vl(auVar115,auVar121);
                auVar64 = vsubps_avx512vl(auVar65,auVar64);
                auVar65 = vsubps_avx512vl(auVar68,auVar60);
                auVar70 = vsubps_avx512vl(auVar69,auVar61);
                auVar71 = vsubps_avx512vl(auVar64,auVar66);
                auVar72 = vsubps_avx512vl(auVar60,auVar63);
                auVar73 = vsubps_avx512vl(auVar61,auVar62);
                auVar74 = vsubps_avx512vl(auVar66,auVar67);
                auVar75 = vsubps_avx512vl(auVar63,auVar68);
                auVar76 = vsubps_avx512vl(auVar62,auVar69);
                auVar77 = vsubps_avx512vl(auVar67,auVar64);
                auVar78 = vaddps_avx512vl(auVar68,auVar60);
                auVar79 = vaddps_avx512vl(auVar69,auVar61);
                auVar80 = vaddps_avx512vl(auVar64,auVar66);
                auVar81 = vmulps_avx512vl(auVar79,auVar71);
                auVar81 = vfmsub231ps_avx512vl(auVar81,auVar70,auVar80);
                auVar80 = vmulps_avx512vl(auVar80,auVar65);
                auVar80 = vfmsub231ps_avx512vl(auVar80,auVar71,auVar78);
                auVar32._4_4_ = auVar78._4_4_ * auVar70._4_4_;
                auVar32._0_4_ = auVar78._0_4_ * auVar70._0_4_;
                auVar32._8_4_ = auVar78._8_4_ * auVar70._8_4_;
                auVar32._12_4_ = auVar78._12_4_ * auVar70._12_4_;
                auVar32._16_4_ = auVar78._16_4_ * auVar70._16_4_;
                auVar32._20_4_ = auVar78._20_4_ * auVar70._20_4_;
                auVar32._24_4_ = auVar78._24_4_ * auVar70._24_4_;
                auVar32._28_4_ = auVar78._28_4_;
                auVar59 = vfmsub231ps_fma(auVar32,auVar65,auVar79);
                auVar109._0_4_ = fVar117 * auVar59._0_4_;
                auVar109._4_4_ = fVar117 * auVar59._4_4_;
                auVar109._8_4_ = fVar117 * auVar59._8_4_;
                auVar109._12_4_ = fVar117 * auVar59._12_4_;
                auVar109._16_4_ = fVar117 * 0.0;
                auVar109._20_4_ = fVar117 * 0.0;
                auVar109._24_4_ = fVar117 * 0.0;
                auVar109._28_4_ = 0;
                auVar78 = vfmadd231ps_avx512vl(auVar109,auVar110,auVar80);
                auVar78 = vfmadd231ps_avx512vl(auVar78,auVar105,auVar81);
                auVar116._0_4_ = auVar60._0_4_ + auVar63._0_4_;
                auVar116._4_4_ = auVar60._4_4_ + auVar63._4_4_;
                auVar116._8_4_ = auVar60._8_4_ + auVar63._8_4_;
                auVar116._12_4_ = auVar60._12_4_ + auVar63._12_4_;
                auVar116._16_4_ = auVar60._16_4_ + auVar63._16_4_;
                auVar116._20_4_ = auVar60._20_4_ + auVar63._20_4_;
                auVar116._24_4_ = auVar60._24_4_ + auVar63._24_4_;
                auVar116._28_4_ = auVar60._28_4_ + auVar63._28_4_;
                auVar79 = vaddps_avx512vl(auVar61,auVar62);
                auVar80 = vaddps_avx512vl(auVar66,auVar67);
                auVar81 = vmulps_avx512vl(auVar79,auVar74);
                auVar81 = vfmsub231ps_avx512vl(auVar81,auVar73,auVar80);
                auVar80 = vmulps_avx512vl(auVar80,auVar72);
                auVar80 = vfmsub231ps_avx512vl(auVar80,auVar74,auVar116);
                auVar82 = vmulps_avx512vl(auVar116,auVar73);
                auVar79 = vfmsub231ps_avx512vl(auVar82,auVar72,auVar79);
                auVar33._4_4_ = fVar117 * auVar79._4_4_;
                auVar33._0_4_ = fVar117 * auVar79._0_4_;
                auVar33._8_4_ = fVar117 * auVar79._8_4_;
                auVar33._12_4_ = fVar117 * auVar79._12_4_;
                auVar33._16_4_ = fVar117 * auVar79._16_4_;
                auVar33._20_4_ = fVar117 * auVar79._20_4_;
                auVar33._24_4_ = fVar117 * auVar79._24_4_;
                auVar33._28_4_ = auVar79._28_4_;
                auVar79 = vfmadd231ps_avx512vl(auVar33,auVar110,auVar80);
                auVar79 = vfmadd231ps_avx512vl(auVar79,auVar105,auVar81);
                auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar63 = vaddps_avx512vl(auVar63,auVar68);
                auVar62 = vaddps_avx512vl(auVar62,auVar69);
                auVar64 = vaddps_avx512vl(auVar67,auVar64);
                auVar67 = vmulps_avx512vl(auVar62,auVar77);
                auVar67 = vfmsub231ps_avx512vl(auVar67,auVar76,auVar64);
                auVar64 = vmulps_avx512vl(auVar64,auVar75);
                auVar64 = vfmsub231ps_avx512vl(auVar64,auVar77,auVar63);
                auVar34._4_4_ = auVar63._4_4_ * auVar76._4_4_;
                auVar34._0_4_ = auVar63._0_4_ * auVar76._0_4_;
                auVar34._8_4_ = auVar63._8_4_ * auVar76._8_4_;
                auVar34._12_4_ = auVar63._12_4_ * auVar76._12_4_;
                auVar34._16_4_ = auVar63._16_4_ * auVar76._16_4_;
                auVar34._20_4_ = auVar63._20_4_ * auVar76._20_4_;
                auVar34._24_4_ = auVar63._24_4_ * auVar76._24_4_;
                auVar34._28_4_ = auVar63._28_4_;
                auVar59 = vfmsub231ps_fma(auVar34,auVar75,auVar62);
                auVar63 = vmulps_avx512vl(auVar113,ZEXT1632(auVar59));
                auVar63 = vfmadd231ps_avx512vl(auVar63,auVar110,auVar64);
                auVar63 = vfmadd231ps_avx512vl(auVar63,auVar105,auVar67);
                auVar93._0_4_ = auVar78._0_4_ + auVar79._0_4_;
                auVar93._4_4_ = auVar78._4_4_ + auVar79._4_4_;
                auVar93._8_4_ = auVar78._8_4_ + auVar79._8_4_;
                auVar93._12_4_ = auVar78._12_4_ + auVar79._12_4_;
                auVar93._16_4_ = auVar78._16_4_ + auVar79._16_4_;
                auVar93._20_4_ = auVar78._20_4_ + auVar79._20_4_;
                auVar93._24_4_ = auVar78._24_4_ + auVar79._24_4_;
                auVar93._28_4_ = auVar78._28_4_ + auVar79._28_4_;
                local_1300 = vaddps_avx512vl(auVar63,auVar93);
                vandps_avx512vl(local_1300,auVar80);
                auVar25._8_4_ = 0x34000000;
                auVar25._0_8_ = 0x3400000034000000;
                auVar25._12_4_ = 0x34000000;
                auVar25._16_4_ = 0x34000000;
                auVar25._20_4_ = 0x34000000;
                auVar25._24_4_ = 0x34000000;
                auVar25._28_4_ = 0x34000000;
                auVar62 = vmulps_avx512vl(local_1300,auVar25);
                auVar64 = vminps_avx512vl(auVar78,auVar79);
                auVar64 = vminps_avx512vl(auVar64,auVar63);
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar26._16_4_ = 0x80000000;
                auVar26._20_4_ = 0x80000000;
                auVar26._24_4_ = 0x80000000;
                auVar26._28_4_ = 0x80000000;
                auVar67 = vxorps_avx512vl(auVar62,auVar26);
                uVar21 = vcmpps_avx512vl(auVar64,auVar67,5);
                auVar64 = vmaxps_avx512vl(auVar78,auVar79);
                auVar63 = vmaxps_avx512vl(auVar64,auVar63);
                uVar22 = vcmpps_avx512vl(auVar63,auVar62,2);
                local_12d8 = (byte)uVar21 | (byte)uVar22;
                if (local_12d8 != 0) {
                  auVar63 = vmulps_avx512vl(auVar71,auVar73);
                  auVar62 = vmulps_avx512vl(auVar65,auVar74);
                  auVar64 = vmulps_avx512vl(auVar70,auVar72);
                  auVar67 = vmulps_avx512vl(auVar74,auVar76);
                  auVar68 = vmulps_avx512vl(auVar72,auVar77);
                  auVar69 = vmulps_avx512vl(auVar73,auVar75);
                  auVar70 = vfmsub213ps_avx512vl(auVar70,auVar74,auVar63);
                  auVar71 = vfmsub213ps_avx512vl(auVar71,auVar72,auVar62);
                  auVar65 = vfmsub213ps_avx512vl(auVar65,auVar73,auVar64);
                  auVar73 = vfmsub213ps_avx512vl(auVar77,auVar73,auVar67);
                  auVar74 = vfmsub213ps_avx512vl(auVar75,auVar74,auVar68);
                  auVar72 = vfmsub213ps_avx512vl(auVar76,auVar72,auVar69);
                  vandps_avx512vl(auVar63,auVar80);
                  vandps_avx512vl(auVar67,auVar80);
                  uVar39 = vcmpps_avx512vl(auVar72,auVar72,1);
                  vandps_avx512vl(auVar62,auVar80);
                  vandps_avx512vl(auVar68,auVar80);
                  uVar42 = vcmpps_avx512vl(auVar72,auVar72,1);
                  vandps_avx512vl(auVar64,auVar80);
                  vandps_avx512vl(auVar69,auVar80);
                  uVar47 = vcmpps_avx512vl(auVar72,auVar72,1);
                  bVar52 = (bool)((byte)uVar39 & 1);
                  auVar83._0_4_ =
                       (float)((uint)bVar52 * auVar70._0_4_ | (uint)!bVar52 * auVar73._0_4_);
                  bVar52 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar83._4_4_ =
                       (float)((uint)bVar52 * auVar70._4_4_ | (uint)!bVar52 * auVar73._4_4_);
                  bVar52 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar83._8_4_ =
                       (float)((uint)bVar52 * auVar70._8_4_ | (uint)!bVar52 * auVar73._8_4_);
                  bVar52 = (bool)((byte)(uVar39 >> 3) & 1);
                  auVar83._12_4_ =
                       (float)((uint)bVar52 * auVar70._12_4_ | (uint)!bVar52 * auVar73._12_4_);
                  bVar52 = (bool)((byte)(uVar39 >> 4) & 1);
                  auVar83._16_4_ =
                       (float)((uint)bVar52 * auVar70._16_4_ | (uint)!bVar52 * auVar73._16_4_);
                  bVar52 = (bool)((byte)(uVar39 >> 5) & 1);
                  auVar83._20_4_ =
                       (float)((uint)bVar52 * auVar70._20_4_ | (uint)!bVar52 * auVar73._20_4_);
                  bVar52 = (bool)((byte)(uVar39 >> 6) & 1);
                  auVar83._24_4_ =
                       (float)((uint)bVar52 * auVar70._24_4_ | (uint)!bVar52 * auVar73._24_4_);
                  bVar52 = SUB81(uVar39 >> 7,0);
                  auVar83._28_4_ = (uint)bVar52 * auVar70._28_4_ | (uint)!bVar52 * auVar73._28_4_;
                  bVar52 = (bool)((byte)uVar42 & 1);
                  auVar84._0_4_ =
                       (float)((uint)bVar52 * auVar71._0_4_ | (uint)!bVar52 * auVar74._0_4_);
                  bVar52 = (bool)((byte)(uVar42 >> 1) & 1);
                  auVar84._4_4_ =
                       (float)((uint)bVar52 * auVar71._4_4_ | (uint)!bVar52 * auVar74._4_4_);
                  bVar52 = (bool)((byte)(uVar42 >> 2) & 1);
                  auVar84._8_4_ =
                       (float)((uint)bVar52 * auVar71._8_4_ | (uint)!bVar52 * auVar74._8_4_);
                  bVar52 = (bool)((byte)(uVar42 >> 3) & 1);
                  auVar84._12_4_ =
                       (float)((uint)bVar52 * auVar71._12_4_ | (uint)!bVar52 * auVar74._12_4_);
                  bVar52 = (bool)((byte)(uVar42 >> 4) & 1);
                  auVar84._16_4_ =
                       (float)((uint)bVar52 * auVar71._16_4_ | (uint)!bVar52 * auVar74._16_4_);
                  bVar52 = (bool)((byte)(uVar42 >> 5) & 1);
                  auVar84._20_4_ =
                       (float)((uint)bVar52 * auVar71._20_4_ | (uint)!bVar52 * auVar74._20_4_);
                  bVar52 = (bool)((byte)(uVar42 >> 6) & 1);
                  auVar84._24_4_ =
                       (float)((uint)bVar52 * auVar71._24_4_ | (uint)!bVar52 * auVar74._24_4_);
                  bVar52 = SUB81(uVar42 >> 7,0);
                  auVar84._28_4_ = (uint)bVar52 * auVar71._28_4_ | (uint)!bVar52 * auVar74._28_4_;
                  bVar52 = (bool)((byte)uVar47 & 1);
                  fVar53 = (float)((uint)bVar52 * auVar65._0_4_ | (uint)!bVar52 * auVar72._0_4_);
                  bVar52 = (bool)((byte)(uVar47 >> 1) & 1);
                  fVar85 = (float)((uint)bVar52 * auVar65._4_4_ | (uint)!bVar52 * auVar72._4_4_);
                  bVar52 = (bool)((byte)(uVar47 >> 2) & 1);
                  fVar86 = (float)((uint)bVar52 * auVar65._8_4_ | (uint)!bVar52 * auVar72._8_4_);
                  bVar52 = (bool)((byte)(uVar47 >> 3) & 1);
                  fVar87 = (float)((uint)bVar52 * auVar65._12_4_ | (uint)!bVar52 * auVar72._12_4_);
                  bVar52 = (bool)((byte)(uVar47 >> 4) & 1);
                  fVar88 = (float)((uint)bVar52 * auVar65._16_4_ | (uint)!bVar52 * auVar72._16_4_);
                  bVar52 = (bool)((byte)(uVar47 >> 5) & 1);
                  fVar89 = (float)((uint)bVar52 * auVar65._20_4_ | (uint)!bVar52 * auVar72._20_4_);
                  bVar52 = (bool)((byte)(uVar47 >> 6) & 1);
                  fVar90 = (float)((uint)bVar52 * auVar65._24_4_ | (uint)!bVar52 * auVar72._24_4_);
                  bVar52 = SUB81(uVar47 >> 7,0);
                  auVar35._4_4_ = fVar117 * fVar85;
                  auVar35._0_4_ = fVar117 * fVar53;
                  auVar35._8_4_ = fVar117 * fVar86;
                  auVar35._12_4_ = fVar117 * fVar87;
                  auVar35._16_4_ = fVar117 * fVar88;
                  auVar35._20_4_ = fVar117 * fVar89;
                  auVar35._24_4_ = fVar117 * fVar90;
                  auVar35._28_4_ = fVar117;
                  auVar59 = vfmadd213ps_fma(auVar110,auVar84,auVar35);
                  auVar59 = vfmadd213ps_fma(auVar105,auVar83,ZEXT1632(auVar59));
                  auVar63 = ZEXT1632(CONCAT412(auVar59._12_4_ + auVar59._12_4_,
                                               CONCAT48(auVar59._8_4_ + auVar59._8_4_,
                                                        CONCAT44(auVar59._4_4_ + auVar59._4_4_,
                                                                 auVar59._0_4_ + auVar59._0_4_))));
                  auVar111._0_4_ = auVar66._0_4_ * fVar53;
                  auVar111._4_4_ = auVar66._4_4_ * fVar85;
                  auVar111._8_4_ = auVar66._8_4_ * fVar86;
                  auVar111._12_4_ = auVar66._12_4_ * fVar87;
                  auVar111._16_4_ = auVar66._16_4_ * fVar88;
                  auVar111._20_4_ = auVar66._20_4_ * fVar89;
                  auVar111._24_4_ = auVar66._24_4_ * fVar90;
                  auVar111._28_4_ = 0;
                  auVar59 = vfmadd213ps_fma(auVar61,auVar84,auVar111);
                  auVar55 = vfmadd213ps_fma(auVar60,auVar83,ZEXT1632(auVar59));
                  auVar60 = vrcp14ps_avx512vl(auVar63);
                  auVar27._8_4_ = 0x3f800000;
                  auVar27._0_8_ = 0x3f8000003f800000;
                  auVar27._12_4_ = 0x3f800000;
                  auVar27._16_4_ = 0x3f800000;
                  auVar27._20_4_ = 0x3f800000;
                  auVar27._24_4_ = 0x3f800000;
                  auVar27._28_4_ = 0x3f800000;
                  auVar61 = vfnmadd213ps_avx512vl(auVar60,auVar63,auVar27);
                  auVar59 = vfmadd132ps_fma(auVar61,auVar60,auVar60);
                  local_1280 = ZEXT1632(CONCAT412(auVar59._12_4_ * (auVar55._12_4_ + auVar55._12_4_)
                                                  ,CONCAT48(auVar59._8_4_ *
                                                            (auVar55._8_4_ + auVar55._8_4_),
                                                            CONCAT44(auVar59._4_4_ *
                                                                     (auVar55._4_4_ + auVar55._4_4_)
                                                                     ,auVar59._0_4_ *
                                                                      (auVar55._0_4_ + auVar55._0_4_
                                                                      )))));
                  uVar96 = *(undefined4 *)((long)&(local_15c0->org).field_0 + 0xc);
                  auVar28._4_4_ = uVar96;
                  auVar28._0_4_ = uVar96;
                  auVar28._8_4_ = uVar96;
                  auVar28._12_4_ = uVar96;
                  auVar28._16_4_ = uVar96;
                  auVar28._20_4_ = uVar96;
                  auVar28._24_4_ = uVar96;
                  auVar28._28_4_ = uVar96;
                  uVar21 = vcmpps_avx512vl(local_1280,auVar28,0xd);
                  auVar29._8_4_ = 0x80000000;
                  auVar29._0_8_ = 0x8000000080000000;
                  auVar29._12_4_ = 0x80000000;
                  auVar29._16_4_ = 0x80000000;
                  auVar29._20_4_ = 0x80000000;
                  auVar29._24_4_ = 0x80000000;
                  auVar29._28_4_ = 0x80000000;
                  auVar60 = vxorps_avx512vl(auVar63,auVar29);
                  fVar117 = local_15c0->tfar;
                  auVar30._4_4_ = fVar117;
                  auVar30._0_4_ = fVar117;
                  auVar30._8_4_ = fVar117;
                  auVar30._12_4_ = fVar117;
                  auVar30._16_4_ = fVar117;
                  auVar30._20_4_ = fVar117;
                  auVar30._24_4_ = fVar117;
                  auVar30._28_4_ = fVar117;
                  uVar22 = vcmpps_avx512vl(local_1280,auVar30,2);
                  uVar23 = vcmpps_avx512vl(auVar63,auVar60,4);
                  local_12d8 = (byte)uVar21 & (byte)uVar22 & (byte)uVar23 & local_12d8;
                  if (local_12d8 != 0) {
                    auVar2._0_4_ = local_15c0->tfar;
                    auVar2._4_4_ = local_15c0->mask;
                    auVar2._8_4_ = local_15c0->id;
                    auVar2._12_4_ = local_15c0->flags;
                    uVar41 = vextractps_avx(auVar2,1);
                    local_12e0 = &local_15d9;
                    auVar60 = vsubps_avx(local_1300,auVar79);
                    local_1340 = vblendps_avx(auVar78,auVar60,0xf0);
                    auVar60 = vsubps_avx(local_1300,auVar78);
                    local_1320 = vblendps_avx(auVar79,auVar60,0xf0);
                    fVar117 = (float)DAT_01fef940;
                    fVar15 = DAT_01fef940._4_4_;
                    local_1260._4_4_ = auVar83._4_4_ * fVar15;
                    local_1260._0_4_ = auVar83._0_4_ * fVar117;
                    fVar16 = DAT_01fef940._8_4_;
                    local_1260._8_4_ = auVar83._8_4_ * fVar16;
                    fVar17 = DAT_01fef940._12_4_;
                    local_1260._12_4_ = auVar83._12_4_ * fVar17;
                    fVar18 = DAT_01fef940._16_4_;
                    local_1260._16_4_ = auVar83._16_4_ * fVar18;
                    fVar19 = DAT_01fef940._20_4_;
                    local_1260._20_4_ = auVar83._20_4_ * fVar19;
                    fVar20 = DAT_01fef940._24_4_;
                    local_1260._24_4_ = auVar83._24_4_ * fVar20;
                    local_1260._28_4_ = auVar83._28_4_;
                    local_1240[0] = auVar84._0_4_ * fVar117;
                    local_1240[1] = auVar84._4_4_ * fVar15;
                    local_1240[2] = auVar84._8_4_ * fVar16;
                    local_1240[3] = auVar84._12_4_ * fVar17;
                    fStack_1230 = auVar84._16_4_ * fVar18;
                    fStack_122c = auVar84._20_4_ * fVar19;
                    fStack_1228 = auVar84._24_4_ * fVar20;
                    uStack_1224 = auVar84._28_4_;
                    local_1220[0] = fVar53 * fVar117;
                    local_1220[1] = fVar85 * fVar15;
                    local_1220[2] = fVar86 * fVar16;
                    local_1220[3] = fVar87 * fVar17;
                    fStack_1210 = fVar88 * fVar18;
                    fStack_120c = fVar89 * fVar19;
                    fStack_1208 = fVar90 * fVar20;
                    uStack_1204 = (uint)bVar52 * auVar65._28_4_ | (uint)!bVar52 * auVar72._28_4_;
                    local_15d0 = (local_1598->geometries).items[local_1590].ptr;
                    if ((local_15d0->mask & uVar41) != 0) {
                      local_15c8 = local_1588->args;
                      if ((local_15c8->filter == (RTCFilterFunctionN)0x0) &&
                         (local_15d0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0069e570:
                        local_15c0->tfar = -INFINITY;
                        return;
                      }
                      auVar60 = vpbroadcastd_avx512vl();
                      auVar60 = vpaddd_avx2(auVar60,_DAT_01fec4a0);
                      auVar61 = vpbroadcastd_avx512vl();
                      auVar61 = vpaddd_avx2(auVar61,_DAT_01fec4c0);
                      auVar103._0_4_ = (float)(int)(*(ushort *)(local_1520 + 8 + local_1528) - 1);
                      auVar103._4_12_ = auVar66._4_12_;
                      auVar38._12_4_ = 0;
                      auVar38._0_12_ = ZEXT812(0);
                      auVar55 = vrcp14ss_avx512f(auVar38 << 0x20,ZEXT416((uint)auVar103._0_4_));
                      auVar59 = vfnmadd213ss_fma(auVar103,auVar55,SUB6416(ZEXT464(0x40000000),0));
                      auVar106._0_4_ = (float)(int)(*(ushort *)(local_1520 + 10 + local_1528) - 1);
                      auVar106._4_12_ = auVar78._4_12_;
                      fVar90 = auVar55._0_4_ * auVar59._0_4_;
                      auVar55 = vrcp14ss_avx512f(auVar38 << 0x20,ZEXT416((uint)auVar106._0_4_));
                      auVar59 = vfnmadd213ss_fma(auVar106,auVar55,SUB6416(ZEXT464(0x40000000),0));
                      fVar15 = auVar59._0_4_ * auVar55._0_4_;
                      auVar60 = vcvtdq2ps_avx(auVar60);
                      auVar61 = vcvtdq2ps_avx(auVar61);
                      auVar31._8_4_ = 0x219392ef;
                      auVar31._0_8_ = 0x219392ef219392ef;
                      auVar31._12_4_ = 0x219392ef;
                      auVar31._16_4_ = 0x219392ef;
                      auVar31._20_4_ = 0x219392ef;
                      auVar31._24_4_ = 0x219392ef;
                      auVar31._28_4_ = 0x219392ef;
                      uVar39 = vcmpps_avx512vl(local_1300,auVar31,5);
                      auVar63 = vrcp14ps_avx512vl(local_1300);
                      auVar104._8_4_ = 0x3f800000;
                      auVar104._0_8_ = 0x3f8000003f800000;
                      auVar104._12_4_ = 0x3f800000;
                      auVar104._16_4_ = 0x3f800000;
                      auVar104._20_4_ = 0x3f800000;
                      auVar104._24_4_ = 0x3f800000;
                      auVar104._28_4_ = 0x3f800000;
                      auVar59 = vfnmadd213ps_fma(local_1300,auVar63,auVar104);
                      auVar62 = vfmadd132ps_avx512vl(ZEXT1632(auVar59),auVar63,auVar63);
                      fVar89 = (float)((uint)((byte)uVar39 & 1) * auVar62._0_4_);
                      fVar88 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar62._4_4_);
                      fVar87 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar62._8_4_);
                      fVar86 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar62._12_4_);
                      fVar85 = (float)((uint)((byte)(uVar39 >> 4) & 1) * auVar62._16_4_);
                      fVar53 = (float)((uint)((byte)(uVar39 >> 5) & 1) * auVar62._20_4_);
                      fVar117 = (float)((uint)((byte)(uVar39 >> 6) & 1) * auVar62._24_4_);
                      auVar36._4_4_ =
                           (local_1300._4_4_ * auVar60._4_4_ + local_1340._4_4_) * fVar90 * fVar88;
                      auVar36._0_4_ =
                           (local_1300._0_4_ * auVar60._0_4_ + local_1340._0_4_) * fVar90 * fVar89;
                      auVar36._8_4_ =
                           (local_1300._8_4_ * auVar60._8_4_ + local_1340._8_4_) * fVar90 * fVar87;
                      auVar36._12_4_ =
                           (local_1300._12_4_ * auVar60._12_4_ + local_1340._12_4_) * fVar90 *
                           fVar86;
                      auVar36._16_4_ =
                           (local_1300._16_4_ * auVar60._16_4_ + local_1340._16_4_) * fVar90 *
                           fVar85;
                      auVar36._20_4_ =
                           (local_1300._20_4_ * auVar60._20_4_ + local_1340._20_4_) * fVar90 *
                           fVar53;
                      auVar36._24_4_ =
                           (local_1300._24_4_ * auVar60._24_4_ + local_1340._24_4_) * fVar90 *
                           fVar117;
                      auVar36._28_4_ = auVar63._28_4_;
                      local_12c0 = vminps_avx(auVar36,auVar104);
                      auVar37._4_4_ =
                           (local_1300._4_4_ * auVar61._4_4_ + local_1320._4_4_) * fVar15 * fVar88;
                      auVar37._0_4_ =
                           (local_1300._0_4_ * auVar61._0_4_ + local_1320._0_4_) * fVar15 * fVar89;
                      auVar37._8_4_ =
                           (local_1300._8_4_ * auVar61._8_4_ + local_1320._8_4_) * fVar15 * fVar87;
                      auVar37._12_4_ =
                           (local_1300._12_4_ * auVar61._12_4_ + local_1320._12_4_) * fVar15 *
                           fVar86;
                      auVar37._16_4_ =
                           (local_1300._16_4_ * auVar61._16_4_ + local_1320._16_4_) * fVar15 *
                           fVar85;
                      auVar37._20_4_ =
                           (local_1300._20_4_ * auVar61._20_4_ + local_1320._20_4_) * fVar15 *
                           fVar53;
                      auVar37._24_4_ =
                           (local_1300._24_4_ * auVar61._24_4_ + local_1320._24_4_) * fVar15 *
                           fVar117;
                      auVar37._28_4_ = (uint)(byte)(uVar39 >> 7) * auVar62._28_4_;
                      local_12a0 = vminps_avx(auVar37,auVar104);
                      local_15b0 = 0;
                      local_15b8 = (ulong)local_12d8;
                      for (uVar39 = local_15b8; (uVar39 & 1) == 0;
                          uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                        local_15b0 = local_15b0 + 1;
                      }
                      local_15d8 = local_1588->user;
                      local_1420 = auVar125._0_32_;
                      local_1440 = auVar126._0_32_;
                      local_1460 = auVar127._0_32_;
                      local_1480 = auVar128._0_32_;
                      local_14a0 = auVar129._0_32_;
                      local_1580 = auVar2;
                      do {
                        auVar59 = auVar124._0_16_;
                        local_14f4 = *(undefined4 *)(local_12c0 + local_15b0 * 4);
                        local_14f0 = *(undefined4 *)(local_12a0 + local_15b0 * 4);
                        local_15c0->tfar = *(float *)(local_1280 + local_15b0 * 4);
                        local_1500 = local_1240[local_15b0 - 8];
                        local_14fc = local_1240[local_15b0];
                        local_14f8 = local_1220[local_15b0];
                        local_14ec = (undefined4)local_1558;
                        local_14e8 = (undefined4)local_1590;
                        local_14e4 = local_15d8->instID[0];
                        local_14e0 = local_15d8->instPrimID[0];
                        local_159c = -1;
                        local_14d0.valid = &local_159c;
                        local_14d0.geometryUserPtr = local_15d0->userPtr;
                        local_14d0.context = local_15d8;
                        local_14d0.ray = (RTCRayN *)local_15c0;
                        local_14d0.hit = (RTCHitN *)&local_1500;
                        local_14d0.N = 1;
                        if (((local_15d0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                            ((*local_15d0->occlusionFilterN)(&local_14d0), *local_14d0.valid != 0))
                           && ((local_15c8->filter == (RTCFilterFunctionN)0x0 ||
                               ((((local_15c8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                                  RTC_RAY_QUERY_FLAG_INCOHERENT &&
                                 (((local_15d0->field_8).field_0x2 & 0x40) == 0)) ||
                                ((*local_15c8->filter)(&local_14d0), *local_14d0.valid != 0))))))
                        goto LAB_0069e570;
                        local_15c0->tfar = (float)local_1580._0_4_;
                        uVar39 = local_15b0 & 0x3f;
                        local_15b0 = 0;
                        local_15b8 = local_15b8 ^ 1L << uVar39;
                        for (uVar39 = local_15b8; (uVar39 & 1) == 0;
                            uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                          local_15b0 = local_15b0 + 1;
                        }
                        auVar59 = vxorps_avx512vl(auVar59,auVar59);
                        auVar124 = ZEXT1664(auVar59);
                        auVar125 = ZEXT3264(local_1420);
                        auVar126 = ZEXT3264(local_1440);
                        auVar127 = ZEXT3264(local_1460);
                        auVar128 = ZEXT3264(local_1480);
                        auVar129 = ZEXT3264(local_14a0);
                      } while (local_15b8 != 0);
                    }
                  }
                }
                uVar39 = local_1530 - 1 & local_1530;
                auVar114 = ZEXT3264(local_1360);
                auVar118 = ZEXT3264(local_13a0);
                auVar120 = ZEXT3264(local_13c0);
                auVar122 = ZEXT3264(local_13e0);
                auVar123 = ZEXT3264(local_1400);
                ray = local_15c0;
                lVar50 = local_1560;
                lVar51 = local_1568;
                fVar89 = local_1380;
                fVar117 = fStack_137c;
                fVar53 = fStack_1378;
                fVar85 = fStack_1374;
                fVar86 = fStack_1370;
                fVar87 = fStack_136c;
                fVar88 = fStack_1368;
              } while (uVar39 != 0);
            }
            local_1548 = local_1548 + 1;
          } while (local_1548 != local_1540);
        }
LAB_0069e558:
      } while (local_1538 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }